

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-copy-mpi.c
# Opt level: O1

int main(int argc,char **argv)

{
  size_t sVar1;
  int iVar2;
  BigAttr *pBVar3;
  ulong uVar4;
  ulong extraout_RAX;
  int iVar5;
  char **ppcVar6;
  long lVar7;
  ulong uVar8;
  uint *unaff_R12;
  ulong uVar9;
  undefined *unaff_R13;
  ulong uVar10;
  BigBlock *count;
  char acVar11 [8];
  undefined4 uStack_b0;
  int iStack_ac;
  ulong uStack_90;
  ulong uStack_88;
  undefined4 uStack_7c;
  char **ppcStack_78;
  uint *puStack_70;
  undefined *puStack_68;
  BigBlock *pBStack_60;
  undefined1 local_48 [8];
  size_t nattr;
  char **ppcStack_38;
  int argc_local;
  char **argv_local;
  
  nattr._4_4_ = argc;
  ppcStack_38 = argv;
  MPI_Init((long)&nattr + 4,&stack0xffffffffffffffc8);
  MPI_Comm_rank(&ompi_mpi_comm_world,&ThisTask);
  MPI_Comm_size(&ompi_mpi_comm_world,&NTask);
  MPI_Type_contiguous(2,&ompi_mpi_long,&MPI_TYPE_WORK);
  MPI_Type_commit(&MPI_TYPE_WORK);
  iVar2 = getopt(nattr._4_4_,ppcStack_38,"n:N:vb:f:");
  if (iVar2 != -1) {
    unaff_R12 = &switchD_0010398e::switchdataD_0010c004;
    unaff_R13 = &optarg;
    do {
      switch((iVar2 - 0x4eU) * 0x40000000 | iVar2 - 0x4eU >> 2) {
      case 0:
      case 8:
        Nfile = atoi(_optarg);
        break;
      default:
        main_cold_1();
        goto LAB_00103bde;
      case 5:
        __isoc99_sscanf(_optarg,"%td",&buffersize);
        break;
      case 6:
        newfilepath = _optarg;
        break;
      case 10:
        verbose = 1;
      }
      iVar2 = getopt(nattr._4_4_,ppcStack_38,"n:N:vb:f:");
    } while (iVar2 != -1);
  }
  if (nattr._4_4_ - _optind == 3) {
    ppcVar6 = ppcStack_38 + _optind;
    ppcStack_38 = ppcVar6 + -1;
    iVar2 = big_file_mpi_open(&bf,*ppcVar6,(MPI_Comm)&ompi_mpi_comm_world);
    if (iVar2 != 0) goto LAB_00103be3;
    iVar2 = big_file_mpi_open_block(&bf,&bb,ppcStack_38[2],(MPI_Comm)&ompi_mpi_comm_world);
    if (iVar2 != 0) goto LAB_00103be8;
    if (bb.Nfile == 0 || Nfile == -1) {
      Nfile = bb.Nfile;
    }
    if (newfilepath == (char *)0x0) {
      newfilepath = ppcStack_38[1];
    }
    ppcVar6 = (char **)&ompi_mpi_comm_world;
    iVar2 = big_file_mpi_create(&bfnew,newfilepath,(MPI_Comm)&ompi_mpi_comm_world);
    if (iVar2 != 0) goto LAB_00103bed;
    pBStack_60 = (BigBlock *)0x103ae7;
    iVar2 = big_file_mpi_create_block
                      (&bfnew,&bbnew,ppcStack_38[3],bb.dtype,bb.nmemb,Nfile,bb.size,
                       (MPI_Comm)&ompi_mpi_comm_world);
    if (iVar2 == 0) {
      if (bbnew.size == bb.size) {
        count = (BigBlock *)local_48;
        pBVar3 = big_block_list_attrs(&bb,(size_t *)count);
        if ((char  [8])local_48 != (char  [8])0x0) {
          ppcVar6 = &pBVar3->data;
          acVar11[0] = '\0';
          acVar11[1] = '\0';
          acVar11[2] = '\0';
          acVar11[3] = '\0';
          acVar11[4] = '\0';
          acVar11[5] = '\0';
          acVar11[6] = '\0';
          acVar11[7] = '\0';
          count = &bbnew;
          do {
            big_block_set_attr(&bbnew,ppcVar6[-1],*ppcVar6,(char *)((long)ppcVar6 + -0x14),
                               ((BigAttr *)(ppcVar6 + -3))->nmemb);
            acVar11 = (char  [8])((long)acVar11 + 1);
            ppcVar6 = ppcVar6 + 4;
          } while ((ulong)acVar11 < (ulong)local_48);
        }
        if ((0 < bb.nmemb) && (bb.size != 0)) {
          if (ThisTask == 0) {
            server();
          }
          else {
            slave();
          }
        }
        iVar2 = big_block_mpi_close(&bbnew,(MPI_Comm)&ompi_mpi_comm_world);
        if (iVar2 == 0) {
          big_block_mpi_close(&bb,(MPI_Comm)&ompi_mpi_comm_world);
          big_file_mpi_close(&bf,(MPI_Comm)&ompi_mpi_comm_world);
          big_file_mpi_close(&bfnew,(MPI_Comm)&ompi_mpi_comm_world);
          return 0;
        }
        main_cold_7();
        sVar1 = buffersize;
        lVar7 = (long)bb.nmemb;
        ppcStack_78 = ppcVar6;
        puStack_70 = unaff_R12;
        puStack_68 = unaff_R13;
        pBStack_60 = count;
        iVar2 = big_file_dtype_itemsize(bb.dtype);
        uVar8 = 0;
        uVar4 = sVar1 / (ulong)(iVar2 * lVar7);
        uVar9 = uVar4;
        do {
          iVar2 = (int)uVar4;
          if (bb.size <= uVar8) break;
          uStack_7c = 0;
          uVar4 = MPI_Recv(&uStack_7c,1,&ompi_mpi_int,0xffffffff,0xffffffff,&ompi_mpi_comm_world,
                           &uStack_b0);
          iVar5 = iStack_ac;
          if (iStack_ac != 0x50f) {
            uVar10 = bb.size - uVar8;
            if (uVar8 + uVar9 <= bb.size) {
              uVar10 = uVar9;
            }
            uStack_90 = uVar8;
            uStack_88 = uVar10;
            uVar4 = MPI_Send(&uStack_90,1,MPI_TYPE_WORK,uStack_b0,0x50b,&ompi_mpi_comm_world);
            uVar8 = uVar8 + uVar10;
            uVar9 = uVar10;
            if (verbose != 0) {
              server_cold_1();
              uVar4 = extraout_RAX;
            }
          }
          iVar2 = (int)uVar4;
        } while (iVar5 != 0x50f);
        if (1 < NTask) {
          iVar5 = 1;
          do {
            iVar2 = MPI_Send(&uStack_b0,1,MPI_TYPE_WORK,iVar5,0x50a,&ompi_mpi_comm_world);
            iVar5 = iVar5 + 1;
          } while (iVar5 < NTask);
        }
        return iVar2;
      }
      goto LAB_00103bf7;
    }
  }
  else {
LAB_00103bde:
    main_cold_2();
LAB_00103be3:
    main_cold_3();
LAB_00103be8:
    main_cold_4();
LAB_00103bed:
    main_cold_5();
  }
  main_cold_6();
LAB_00103bf7:
  abort();
}

Assistant:

int main(int argc, char * argv[]) {

    MPI_Init(&argc, &argv);

    MPI_Comm_rank(MPI_COMM_WORLD, &ThisTask);
    MPI_Comm_size(MPI_COMM_WORLD, &NTask);

    MPI_Type_contiguous(2, MPI_LONG, &MPI_TYPE_WORK);
    MPI_Type_commit(&MPI_TYPE_WORK);

    int ch;
    while(-1 != (ch = getopt(argc, argv, "n:N:vb:f:"))) {
        switch(ch) {
            case 'N':
            case 'n':
                Nfile = atoi(optarg);
                break;
            case 'b':
                sscanf(optarg, "%td", &buffersize);
                break;
            case 'f':
                newfilepath = optarg;
                break;
            case 'v':
                verbose = 1;
                break;
            default:
                usage();
        }
    }
    if(argc - optind + 1 != 4) {
        usage();
    }
    argv += optind - 1;
    if(0 != big_file_mpi_open(&bf, argv[1], MPI_COMM_WORLD)) {
        fprintf(stderr, "failed to open: %s\n", big_file_get_error_message());
        exit(1);
    }
    if(0 != big_file_mpi_open_block(&bf, &bb, argv[2], MPI_COMM_WORLD)) {
        fprintf(stderr, "failed to open: %s\n", big_file_get_error_message());
        exit(1);
    }
    if(Nfile == -1 || bb.Nfile == 0) {
        Nfile = bb.Nfile;
    }
    if(newfilepath == NULL) {
        newfilepath = argv[1];
    }
    if(0 != big_file_mpi_create(&bfnew, newfilepath, MPI_COMM_WORLD)) {
        fprintf(stderr, "failed to open: %s\n", big_file_get_error_message());
        exit(1);
    }
    if(0 != big_file_mpi_create_block(&bfnew, &bbnew, argv[3], bb.dtype, bb.nmemb, Nfile, bb.size, MPI_COMM_WORLD)) {
        fprintf(stderr, "failed to create temp: %s\n", big_file_get_error_message());
        exit(1);
    }

    if(bbnew.size != bb.size) {
        abort();
    }

    /* copy attrs */
    size_t nattr;
    BigAttr * attrs = big_block_list_attrs(&bb, &nattr);
    int i;
    for(i = 0; i < nattr; i ++) {
        BigAttr * attr = &attrs[i];
        big_block_set_attr(&bbnew, attr->name, attr->data, attr->dtype, attr->nmemb);
    }

    if(bb.nmemb > 0 && bb.size > 0) {
    /* copy data */
        if(ThisTask == 0) {
            server();
        } else {
            slave();
        }
    }
    if(0 != big_block_mpi_close(&bbnew, MPI_COMM_WORLD)) {
        fprintf(stderr, "failed to close new: %s\n", big_file_get_error_message());
        exit(1);
    }
    big_block_mpi_close(&bb, MPI_COMM_WORLD);
    big_file_mpi_close(&bf, MPI_COMM_WORLD);
    big_file_mpi_close(&bfnew, MPI_COMM_WORLD);
    return 0;
}